

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlGlyphDefn.h
# Opt level: O1

string * __thiscall
GdlGlyphDefn::GlyphIDString_abi_cxx11_
          (string *__return_storage_ptr__,GdlGlyphDefn *this,gid16 wGlyphID)

{
  _func_int **pp_Var1;
  _func_int *p_Var2;
  code cVar3;
  ostream *poVar4;
  _func_int *p_Var5;
  ostringstream strmStr;
  char local_1a1;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," [0x",4);
  pp_Var1 = poVar4->_vptr_basic_ostream;
  p_Var2 = pp_Var1[-3];
  *(uint *)(&poVar4->field_0x18 + (long)p_Var2) =
       *(uint *)(&poVar4->field_0x18 + (long)p_Var2) & 0xffffffb5 | 8;
  p_Var2 = pp_Var1[-3];
  p_Var5 = (_func_int *)((long)&poVar4->_vptr_basic_ostream + (long)p_Var2);
  if ((&poVar4->field_0xe1)[(long)p_Var2] == '\0') {
    cVar3 = (code)std::ios::widen((char)p_Var5);
    p_Var5[0xe0] = cVar3;
    p_Var5[0xe1] = (code)0x1;
  }
  p_Var5[0xe0] = (code)0x30;
  *(undefined8 *)(&poVar4->field_0x10 + (long)poVar4->_vptr_basic_ostream[-3]) = 4;
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  local_1a1 = ']';
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_1a1,1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

static std::string GlyphIDString(gid16 wGlyphID)
	{
		std::ostringstream strmStr;
		strmStr	<< wGlyphID 
				<< " [0x" 
				<< std::hex << std::setfill('0') << std::setw(4) 
				<< wGlyphID << ']';

		return strmStr.str();
	}